

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void i_number_suite::i_number_huge_exp(void)

{
  pointer *__str;
  char *this;
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  view_type local_220 [2];
  undefined4 local_1fc;
  value local_1f8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  undefined1 local_1e0 [8];
  reader reader;
  char input [136];
  
  __str = &reader.stack.c.
           super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  memcpy(__str,
         "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006"
         ,0x88);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,(char *)__str)
  ;
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_1e0,&local_1f0);
  local_1f8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_1e0);
  local_1fc = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x2d,"void i_number_suite::i_number_huge_exp()",local_1f8,&local_1fc);
  local_220[0] = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_1e0)
  ;
  this = 
  "\"0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006\""
  ;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[136]>
            ("reader.literal()",
             "\"0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x2e,"void i_number_suite::i_number_huge_exp()",local_220,
             "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006"
            );
  trial::protocol::json::basic_reader<char>::value<long_double>
            ((longdouble *)local_1e0,(basic_reader<char> *)this);
  std::numeric_limits<long_double>::infinity();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("reader.value<long double>()","std::numeric_limits<long double>::infinity()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x30,"void i_number_suite::i_number_huge_exp()",local_238,local_248);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_1e0);
  return;
}

Assistant:

void i_number_huge_exp()
{
    const char input[] = "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006");
    // Cannot be represented by long double
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<long double>(), std::numeric_limits<long double>::infinity());
}